

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::anon_unknown_160::CompositeReferencesRec
               (uint32_t depth,AssetResolutionResolver *resolver,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_search_paths,Layer *in_layer,PrimSpec *primspec,string *warn,string *err,
               ReferencesCompositionOptions *options)

{
  bool bVar1;
  ostream *poVar2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *this;
  reference primspec_00;
  string *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  PrimMeta *pPVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *this_00;
  ulong uVar7;
  string *psVar8;
  string local_4078 [39];
  allocator local_4051;
  string local_4050;
  string local_4030;
  ostringstream local_4010 [8];
  ostringstream ss_e_10;
  string local_3e98 [39];
  allocator local_3e71;
  string local_3e70 [32];
  fmt local_3e50 [32];
  ostringstream local_3e30 [8];
  ostringstream ss_e_9;
  string local_3cb8 [32];
  string local_3c98;
  allocator local_3c71;
  string local_3c70 [32];
  fmt local_3c50 [32];
  ostringstream local_3c30 [8];
  ostringstream ss_e_8;
  PrimSpec *local_3ab8;
  PrimSpec *src_ps_1;
  Layer layer_1;
  Reference *reference_1;
  const_iterator __end9;
  const_iterator __begin9;
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *__range9;
  ostringstream local_2478 [8];
  ostringstream ss_e_7;
  string local_2300 [32];
  ostringstream local_22e0 [8];
  ostringstream ss_e_6;
  string local_2168 [32];
  ostringstream local_2148 [8];
  ostringstream ss_e_5;
  string local_1fd0 [32];
  ostringstream local_1fb0 [8];
  ostringstream ss_e_4;
  string local_1e38 [39];
  allocator local_1e11;
  string local_1e10;
  string local_1df0;
  ostringstream local_1dd0 [8];
  ostringstream ss_e_3;
  string local_1c58 [39];
  allocator local_1c31;
  string local_1c30 [32];
  fmt local_1c10 [32];
  ostringstream local_1bf0 [8];
  ostringstream ss_e_2;
  string local_1a78 [32];
  string local_1a58;
  allocator local_1a31;
  string local_1a30 [32];
  fmt local_1a10 [32];
  ostringstream local_19f0 [8];
  ostringstream ss_e_1;
  int local_1874;
  PrimSpec *local_1870;
  PrimSpec *src_ps;
  Layer layer;
  Reference *reference;
  const_iterator __end4;
  const_iterator __begin4;
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *__range4;
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *refecences;
  ListEditQual *qual;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  string cwp;
  PrimSpec *child;
  iterator __end2;
  iterator __begin2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *__range2;
  ostringstream local_1c8 [8];
  ostringstream ss_e;
  string *warn_local;
  PrimSpec *primspec_local;
  Layer *in_layer_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *asset_search_paths_local;
  AssetResolutionResolver *resolver_local;
  uint32_t depth_local;
  
  if (options->max_depth < depth) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar2 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x272);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1c8,"Too deep.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&__range2);
      ::std::__cxx11::string::~string((string *)&__range2);
    }
    resolver_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
    goto LAB_0021a2bd;
  }
  this = PrimSpec::children(primspec);
  __end2 = ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::begin
                     ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)this);
  child = (PrimSpec *)
          ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::end
                    ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                                     *)&child), bVar1) {
    primspec_00 = __gnu_cxx::
                  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                  ::operator*(&__end2);
    bVar1 = CompositeReferencesRec
                      (depth + 1,resolver,asset_search_paths,in_layer,primspec_00,warn,err,options);
    if (!bVar1) {
      resolver_local._7_1_ = 0;
      goto LAB_0021a2bd;
    }
    __gnu_cxx::
    __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
    ::operator++(&__end2);
  }
  psVar3 = PrimSpec::get_current_working_path_abi_cxx11_(primspec);
  ::std::__cxx11::string::string
            ((string *)
             &search_paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar3);
  __x = PrimSpec::get_asset_search_paths_abi_cxx11_(primspec);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&qual,__x);
  pPVar4 = PrimSpec::metas(primspec);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPVar4->references);
  if (bVar1) {
    pPVar4 = PrimSpec::metas(primspec);
    pvVar5 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
             ::value(&pPVar4->references);
    pPVar4 = PrimSpec::metas(primspec);
    pvVar6 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
             ::value(&pPVar4->references);
    this_00 = &pvVar6->second;
    if ((pvVar5->first == ResetToExplicit) || (pvVar5->first == Prepend)) {
      __end4 = ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::begin
                         (this_00);
      reference = (Reference *)
                  ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::end
                            (this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_tinyusdz::Reference_*,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
                                         *)&reference), bVar1) {
        layer._asset_resolution_userdata =
             __gnu_cxx::
             __normal_iterator<const_tinyusdz::Reference_*,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
             ::operator*(&__end4);
        Layer::Layer((Layer *)&src_ps);
        local_1870 = (PrimSpec *)0x0;
        tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_
                  ((AssetPath *)layer._asset_resolution_userdata);
        uVar7 = ::std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          bVar1 = LoadAsset(resolver,(string *)
                                     &search_paths.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&qual,&options->fileformats,
                            (AssetPath *)layer._asset_resolution_userdata,
                            (Path *)((long)layer._asset_resolution_userdata + 0x40),(Layer *)&src_ps
                            ,&local_1870,true,(bool)(options->error_when_asset_not_found & 1),
                            (bool)(options->error_when_unsupported_fileformat & 1),warn,err);
          if (bVar1) {
LAB_00219527:
            if (local_1870 == (PrimSpec *)0x0) {
              local_1874 = 7;
            }
            else {
              bVar1 = InheritPrimSpec(primspec,local_1870,warn,err);
              if (bVar1) {
                PrimSpec::typeName_abi_cxx11_(primspec);
                uVar7 = ::std::__cxx11::string::empty();
                if ((uVar7 & 1) == 0) {
                  psVar3 = PrimSpec::typeName_abi_cxx11_(primspec);
                  bVar1 = ::std::operator==(psVar3,"Model");
                  if (bVar1) goto LAB_002196e7;
                }
                else {
LAB_002196e7:
                  PrimSpec::typeName_abi_cxx11_(local_1870);
                  uVar7 = ::std::__cxx11::string::empty();
                  if ((uVar7 & 1) == 0) {
                    psVar3 = PrimSpec::typeName_abi_cxx11_(local_1870);
                    bVar1 = ::std::operator==(psVar3,"Model");
                    if (!bVar1) {
                      psVar3 = PrimSpec::typeName_abi_cxx11_(local_1870);
                      psVar8 = PrimSpec::typeName_abi_cxx11_(primspec);
                      ::std::__cxx11::string::operator=((string *)psVar8,(string *)psVar3);
                    }
                  }
                }
                local_1874 = 0;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1dd0);
                poVar2 = ::std::operator<<((ostream *)local_1dd0,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2b1);
                ::std::operator<<(poVar2," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_1e10,"Failed to reference layer `{}`",&local_1e11);
                fmt::format<tinyusdz::value::AssetPath>
                          (&local_1df0,&local_1e10,(AssetPath *)layer._asset_resolution_userdata);
                poVar2 = ::std::operator<<((ostream *)local_1dd0,(string *)&local_1df0);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::~string((string *)&local_1df0);
                ::std::__cxx11::string::~string((string *)&local_1e10);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1e11);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_1e38);
                  ::std::__cxx11::string::~string(local_1e38);
                }
                resolver_local._7_1_ = 0;
                local_1874 = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_1dd0);
              }
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1bf0);
            poVar2 = ::std::operator<<((ostream *)local_1bf0,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2a5);
            ::std::operator<<(poVar2," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1c30,"Failed to `references` asset `{}`",&local_1c31);
            psVar3 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_
                               ((AssetPath *)layer._asset_resolution_userdata);
            fmt::format<std::__cxx11::string>
                      (local_1c10,(string *)local_1c30,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
            poVar2 = ::std::operator<<((ostream *)local_1bf0,(string *)local_1c10);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::~string((string *)local_1c10);
            ::std::__cxx11::string::~string(local_1c30);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1c31);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_1c58);
              ::std::__cxx11::string::~string(local_1c58);
            }
            resolver_local._7_1_ = 0;
            local_1874 = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1bf0);
          }
        }
        else {
          bVar1 = Path::is_absolute_path((Path *)((long)layer._asset_resolution_userdata + 0x40));
          if (bVar1) {
            bVar1 = Layer::find_primspec_at
                              (in_layer,(Path *)((long)layer._asset_resolution_userdata + 0x40),
                               &local_1870,err);
            if (bVar1) goto LAB_00219527;
            resolver_local._7_1_ = 0;
            local_1874 = 1;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_19f0);
            poVar2 = ::std::operator<<((ostream *)local_19f0,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x297);
            ::std::operator<<(poVar2," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1a30,
                       "Invalid asset path. assetPath is empty and primPath is not absolute path: {}"
                       ,&local_1a31);
            Path::full_path_name_abi_cxx11_
                      (&local_1a58,(Path *)((long)layer._asset_resolution_userdata + 0x40));
            fmt::format<std::__cxx11::string>
                      (local_1a10,(string *)local_1a30,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1a58);
            poVar2 = ::std::operator<<((ostream *)local_19f0,(string *)local_1a10);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::~string((string *)local_1a10);
            ::std::__cxx11::string::~string((string *)&local_1a58);
            ::std::__cxx11::string::~string(local_1a30);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1a31);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_1a78);
              ::std::__cxx11::string::~string(local_1a78);
            }
            resolver_local._7_1_ = 0;
            local_1874 = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_19f0);
          }
        }
        Layer::~Layer((Layer *)&src_ps);
        if ((local_1874 != 0) && (local_1874 != 7)) goto LAB_0021a2a5;
        __gnu_cxx::
        __normal_iterator<const_tinyusdz::Reference_*,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
        ::operator++(&__end4);
      }
      goto LAB_0021a27f;
    }
    if (pvVar5->first == Delete) {
      ::std::__cxx11::ostringstream::ostringstream(local_1fb0);
      poVar2 = ::std::operator<<((ostream *)local_1fb0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2c1);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1fb0,"`delete` references are not supported yet.")
      ;
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_1fd0);
        ::std::__cxx11::string::~string(local_1fd0);
      }
      resolver_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1fb0);
    }
    else if (pvVar5->first == Add) {
      ::std::__cxx11::ostringstream::ostringstream(local_2148);
      poVar2 = ::std::operator<<((ostream *)local_2148,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2c3);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_2148,"`add` references are not supported yet.");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_2168);
        ::std::__cxx11::string::~string(local_2168);
      }
      resolver_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_2148);
    }
    else if (pvVar5->first == Order) {
      ::std::__cxx11::ostringstream::ostringstream(local_22e0);
      poVar2 = ::std::operator<<((ostream *)local_22e0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2c5);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_22e0,"`order` references are not supported yet.");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_2300);
        ::std::__cxx11::string::~string(local_2300);
      }
      resolver_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_22e0);
    }
    else {
      if (pvVar5->first != Invalid) {
        if (pvVar5->first == Append) {
          __end9 = ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::begin
                             (this_00);
          reference_1 = (Reference *)
                        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::
                        end(this_00);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end9,(__normal_iterator<const_tinyusdz::Reference_*,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
                                             *)&reference_1), bVar1) {
            layer_1._asset_resolution_userdata =
                 __gnu_cxx::
                 __normal_iterator<const_tinyusdz::Reference_*,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
                 ::operator*(&__end9);
            Layer::Layer((Layer *)&src_ps_1);
            local_3ab8 = (PrimSpec *)0x0;
            tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_
                      ((AssetPath *)layer_1._asset_resolution_userdata);
            uVar7 = ::std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              bVar1 = LoadAsset(resolver,(string *)
                                         &search_paths.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&qual,&options->fileformats,
                                (AssetPath *)layer_1._asset_resolution_userdata,
                                (Path *)((long)layer_1._asset_resolution_userdata + 0x40),
                                (Layer *)&src_ps_1,&local_3ab8,true,
                                (bool)(options->error_when_asset_not_found & 1),
                                (bool)(options->error_when_unsupported_fileformat & 1),warn,err);
              if (bVar1) {
LAB_0021a001:
                if (local_3ab8 == (PrimSpec *)0x0) {
                  local_1874 = 0x17;
                }
                else {
                  bVar1 = OverridePrimSpec(primspec,local_3ab8,warn,err);
                  if (bVar1) {
                    PrimSpec::typeName_abi_cxx11_(primspec);
                    uVar7 = ::std::__cxx11::string::empty();
                    if ((uVar7 & 1) == 0) {
                      psVar3 = PrimSpec::typeName_abi_cxx11_(primspec);
                      bVar1 = ::std::operator==(psVar3,"Model");
                      if (bVar1) goto LAB_0021a1c1;
                    }
                    else {
LAB_0021a1c1:
                      PrimSpec::typeName_abi_cxx11_(local_3ab8);
                      uVar7 = ::std::__cxx11::string::empty();
                      if ((uVar7 & 1) == 0) {
                        psVar3 = PrimSpec::typeName_abi_cxx11_(local_3ab8);
                        bVar1 = ::std::operator==(psVar3,"Model");
                        if (!bVar1) {
                          psVar3 = PrimSpec::typeName_abi_cxx11_(local_3ab8);
                          psVar8 = PrimSpec::typeName_abi_cxx11_(primspec);
                          ::std::__cxx11::string::operator=((string *)psVar8,(string *)psVar3);
                        }
                      }
                    }
                    local_1874 = 0;
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_4010);
                    poVar2 = ::std::operator<<((ostream *)local_4010,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2ef);
                    ::std::operator<<(poVar2," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              ((string *)&local_4050,"Failed to reference layer `{}`",&local_4051);
                    fmt::format<tinyusdz::value::AssetPath>
                              (&local_4030,&local_4050,
                               (AssetPath *)layer_1._asset_resolution_userdata);
                    poVar2 = ::std::operator<<((ostream *)local_4010,(string *)&local_4030);
                    ::std::operator<<(poVar2,"\n");
                    ::std::__cxx11::string::~string((string *)&local_4030);
                    ::std::__cxx11::string::~string((string *)&local_4050);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_4051);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::__cxx11::string::operator+=((string *)err,local_4078);
                      ::std::__cxx11::string::~string(local_4078);
                    }
                    resolver_local._7_1_ = 0;
                    local_1874 = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_4010);
                  }
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_3e30);
                poVar2 = ::std::operator<<((ostream *)local_3e30,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2e3);
                ::std::operator<<(poVar2," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3e70,"Failed to `references` asset `{}`",&local_3e71);
                psVar3 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_
                                   ((AssetPath *)layer_1._asset_resolution_userdata);
                fmt::format<std::__cxx11::string>
                          (local_3e50,(string *)local_3e70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar3);
                poVar2 = ::std::operator<<((ostream *)local_3e30,(string *)local_3e50);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::~string((string *)local_3e50);
                ::std::__cxx11::string::~string(local_3e70);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_3e71);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_3e98);
                  ::std::__cxx11::string::~string(local_3e98);
                }
                resolver_local._7_1_ = 0;
                local_1874 = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_3e30);
              }
            }
            else {
              bVar1 = Path::is_absolute_path
                                ((Path *)((long)layer_1._asset_resolution_userdata + 0x40));
              if (bVar1) {
                bVar1 = Layer::find_primspec_at
                                  (in_layer,(Path *)((long)layer_1._asset_resolution_userdata + 0x40
                                                    ),&local_3ab8,err);
                if (bVar1) goto LAB_0021a001;
                resolver_local._7_1_ = 0;
                local_1874 = 1;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_3c30);
                poVar2 = ::std::operator<<((ostream *)local_3c30,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2d9);
                ::std::operator<<(poVar2," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3c70,
                           "Invalid asset path. assetPath is empty and primPath is not absolute path: {}"
                           ,&local_3c71);
                Path::full_path_name_abi_cxx11_
                          (&local_3c98,(Path *)((long)layer_1._asset_resolution_userdata + 0x40));
                fmt::format<std::__cxx11::string>
                          (local_3c50,(string *)local_3c70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_3c98);
                poVar2 = ::std::operator<<((ostream *)local_3c30,(string *)local_3c50);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::~string((string *)local_3c50);
                ::std::__cxx11::string::~string((string *)&local_3c98);
                ::std::__cxx11::string::~string(local_3c70);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_3c71);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_3cb8);
                  ::std::__cxx11::string::~string(local_3cb8);
                }
                resolver_local._7_1_ = 0;
                local_1874 = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_3c30);
              }
            }
            Layer::~Layer((Layer *)&src_ps_1);
            if ((local_1874 != 0) && (local_1874 != 0x17)) goto LAB_0021a2a5;
            __gnu_cxx::
            __normal_iterator<const_tinyusdz::Reference_*,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
            ::operator++(&__end9);
          }
        }
        goto LAB_0021a27f;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_2478);
      poVar2 = ::std::operator<<((ostream *)local_2478,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"CompositeReferencesRec");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2c7);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_2478,
                                 "Invalid listedit qualifier to for `references`.");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,(string *)&__range9);
        ::std::__cxx11::string::~string((string *)&__range9);
      }
      resolver_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_2478);
    }
  }
  else {
LAB_0021a27f:
    pPVar4 = PrimSpec::metas(primspec);
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
    ::reset(&pPVar4->references);
    resolver_local._7_1_ = 1;
  }
LAB_0021a2a5:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&qual);
  ::std::__cxx11::string::~string
            ((string *)
             &search_paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0021a2bd:
  return (bool)(resolver_local._7_1_ & 1);
}

Assistant:

bool CompositeReferencesRec(uint32_t depth, AssetResolutionResolver &resolver,
                            const std::vector<std::string> &asset_search_paths,
                            const Layer &in_layer,
                            PrimSpec &primspec /* [inout] */, std::string *warn,
                            std::string *err,
                            const ReferencesCompositionOptions &options) {
  if (depth > options.max_depth) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositeReferencesRec(depth + 1, resolver, asset_search_paths, in_layer, child,
                                warn, err, options)) {
      return false;
    }
  }

  // Use PrimSpec's AssetResolution state.
  std::string cwp = primspec.get_current_working_path();
  std::vector<std::string> search_paths = primspec.get_asset_search_paths();

  if (primspec.metas().references) {
    const ListEditQual &qual = primspec.metas().references.value().first;
    const auto &refecences = primspec.metas().references.value().second;

    if ((qual == ListEditQual::ResetToExplicit) ||
        (qual == ListEditQual::Prepend)) {
      for (const auto &reference : refecences) {
        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (reference.asset_path.GetAssetPath().empty()) {
          if (reference.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(reference.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Invalid asset path. assetPath is empty and "
                            "primPath is not absolute path: {}",
                            reference.prim_path.full_path_name()));
          }
        } else {

          DCOUT("reference.prim_path = " << reference.prim_path);
          DCOUT("primspec.cwp = " << cwp);
          DCOUT("primspec.search_paths = " << search_paths);
          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         reference.asset_path, reference.prim_path, &layer,
                         &src_ps, /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Failed to `references` asset `{}`",
                            reference.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `inherits` op
        if (!InheritPrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to reference layer `{}`",
                                            reference.asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }

        DCOUT("inherit done: primspec = " << primspec.name());
      }

    } else if (qual == ListEditQual::Delete) {
      PUSH_ERROR_AND_RETURN("`delete` references are not supported yet.");
    } else if (qual == ListEditQual::Add) {
      PUSH_ERROR_AND_RETURN("`add` references are not supported yet.");
    } else if (qual == ListEditQual::Order) {
      PUSH_ERROR_AND_RETURN("`order` references are not supported yet.");
    } else if (qual == ListEditQual::Invalid) {
      PUSH_ERROR_AND_RETURN("Invalid listedit qualifier to for `references`.");
    } else if (qual == ListEditQual::Append) {
      for (const auto &reference : refecences) {
        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (reference.asset_path.GetAssetPath().empty()) {
          if (reference.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(reference.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Invalid asset path. assetPath is empty and "
                            "primPath is not absolute path: {}",
                            reference.prim_path.full_path_name()));
          }
        } else {
          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         reference.asset_path, reference.prim_path, &layer,
                         &src_ps, /* error_when_no_prims */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Failed to `references` asset `{}`",
                            reference.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `over` op
        if (!OverridePrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to reference layer `{}`",
                                            reference.asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }
      }
    }

  }

  // Remove `references`.
  primspec.metas().references.reset();

  return true;
}